

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpm_codec.c
# Opt level: O0

UINT32 TSS_GetTpmProperty(TSS_DEVICE *tpm,TPM_PT property)

{
  TPM_RC TVar1;
  LOGGER_LOG p_Var2;
  LOGGER_LOG l_1;
  LOGGER_LOG l;
  TPM_RC TSS_LastResponseCode;
  TPML_TAGGED_TPM_PROPERTY *pProps;
  int local_418;
  TPMS_CAPABILITY_DATA capData;
  TPMI_YES_NO more;
  UINT32 result;
  TPM_PT property_local;
  TSS_DEVICE *tpm_local;
  
  capData.data.handles.handle[0xfc]._3_1_ = 0;
  TVar1 = TPM2_GetCapability(tpm,6,property,1,
                             (TPMI_YES_NO *)((long)capData.data.handles.handle + 0x3f3),
                             (TPMS_CAPABILITY_DATA *)((long)&pProps + 4));
  if ((TVar1 == 0) && (pProps._4_4_ == 6)) {
    if (local_418 == 1) {
      if (capData.capability == property) {
        capData.data.algorithms.algProperties[0x7e].algProperties =
             (TPMA_ALGORITHM)capData.data.algorithms.count;
      }
      else {
        capData.data.handles.handle[0xfd] = 0xffffffff;
      }
    }
    else {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-utpm-c/src/tpm_codec.c"
                  ,"TSS_GetTpmProperty",0x2ab,1,"Capability data count does not equal 1");
      }
      capData.data.handles.handle[0xfd] = 0xffffffff;
    }
  }
  else {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-utpm-c/src/tpm_codec.c"
                ,"TSS_GetTpmProperty",0x2a6,1,"Get Capability failure");
    }
    capData.data.handles.handle[0xfd] = 0xffffffff;
  }
  return capData.data.tpmProperties.tpmProperty[0x7e].value;
}

Assistant:

UINT32 TSS_GetTpmProperty(TSS_DEVICE* tpm, TPM_PT property)
{
    UINT32 result;
    TPMI_YES_NO                 more = NO;
    TPMS_CAPABILITY_DATA        capData;
    TPML_TAGGED_TPM_PROPERTY   *pProps = NULL;

    TPM_RC TSS_LastResponseCode = TPM2_GetCapability(tpm, TPM_CAP_TPM_PROPERTIES, property, 1, &more, &capData);
    if (TSS_LastResponseCode != TPM_RC_SUCCESS || capData.capability != TPM_CAP_TPM_PROPERTIES)
    {
        LogError("Get Capability failure");
        result = TSS_BAD_PROPERTY;
    }
    else if (capData.data.tpmProperties.count != 1)
    {
        LogError("Capability data count does not equal 1");
        result = TSS_BAD_PROPERTY;
    }
    else
    {
        pProps = &capData.data.tpmProperties;
        if (pProps->tpmProperty[0].property != property)
        {
            result = TSS_BAD_PROPERTY;
        }
        else
        {
            result = pProps->tpmProperty[0].value;
        }
    }
    return result;
}